

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O0

int main(void)

{
  Rect rct;
  Rect rct_00;
  TerminalInfo term_00;
  TerminalInfo term_01;
  Border border;
  Border border_00;
  Border border_01;
  Border border_02;
  Border border_03;
  Border border_04;
  Border border_05;
  Border border_06;
  Border border_07;
  Border border_08;
  TerminalInfo term_02;
  TerminalInfo term_03;
  TerminalInfo term_04;
  TerminalInfo term_05;
  TerminalInfo term_06;
  TerminalInfo term_07;
  TerminalInfo term_08;
  TerminalInfo term_09;
  TerminalInfo term_10;
  TerminalInfo term_11;
  BrailleCanvas *pBVar1;
  ostream *poVar2;
  BrailleCanvas **block;
  BrailleCanvas **block_00;
  BrailleCanvas **block_01;
  BrailleCanvas **block_02;
  BrailleCanvas **block_03;
  BrailleCanvas **block_04;
  BrailleCanvas **block_05;
  BrailleCanvas **block_06;
  Frame<plot::BrailleCanvas_*> *block_07;
  BrailleCanvas **block_08;
  Frame<plot::BrailleCanvas_*> *pFVar3;
  GenericPoint<long> GVar4;
  string_view label;
  string_view label_00;
  string_view label_01;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 *local_1c30;
  Border local_1c28;
  Frame<plot::BrailleCanvas_*> local_1ba8;
  Margin<plot::Frame<plot::BrailleCanvas_*>_> local_1ae0;
  long local_19f8;
  undefined1 auStack_19f0 [32];
  undefined1 *local_19d0;
  Border local_19c8;
  Frame<plot::BrailleCanvas_*> local_1948;
  Margin<plot::Frame<plot::BrailleCanvas_*>_> local_1880;
  long local_1798;
  undefined1 auStack_1790 [32];
  undefined1 *local_1770;
  Border local_1768;
  Frame<plot::BrailleCanvas_*> local_16e8;
  Margin<plot::Frame<plot::BrailleCanvas_*>_> local_1620;
  long local_1538;
  undefined1 auStack_1530 [32];
  undefined1 *local_1510;
  Border local_1508;
  Frame<plot::BrailleCanvas_*> local_1488;
  Margin<plot::Frame<plot::BrailleCanvas_*>_> local_13c0;
  long local_12d8;
  undefined1 auStack_12d0 [32];
  undefined1 *local_12b0;
  Border local_12a8;
  Frame<plot::BrailleCanvas_*> local_1228;
  Margin<plot::Frame<plot::BrailleCanvas_*>_> local_1160;
  long local_1078;
  undefined1 auStack_1070 [32];
  undefined1 *local_1050;
  Border local_1048;
  Frame<plot::BrailleCanvas_*> local_fc8;
  Margin<plot::Frame<plot::BrailleCanvas_*>_> local_f00;
  long local_e18;
  undefined1 auStack_e10 [32];
  undefined1 *local_df0;
  Border local_de8;
  Frame<plot::BrailleCanvas_*> local_d68;
  Margin<plot::Frame<plot::BrailleCanvas_*>_> local_ca0;
  long local_bb8;
  undefined1 auStack_bb0 [32];
  undefined1 *local_b90;
  Border local_b88;
  basic_string_view<char,_std::char_traits<char>_> local_b08;
  Frame<plot::BrailleCanvas_*> local_af8;
  Margin<plot::Frame<plot::BrailleCanvas_*>_> local_a30;
  long local_948;
  undefined1 auStack_940 [32];
  undefined1 *local_920;
  Border local_918;
  basic_string_view<char,_std::char_traits<char>_> local_898;
  Frame<plot::BrailleCanvas_*> local_888;
  Margin<plot::Frame<plot::BrailleCanvas_*>_> local_7c0;
  long local_6d8;
  undefined1 auStack_6d0 [40];
  basic_string_view<char,_std::char_traits<char>_> local_6a8;
  Frame<plot::BrailleCanvas_*> local_698;
  Margin<plot::Frame<plot::BrailleCanvas_*>_> local_5d0;
  long local_4e8;
  undefined1 auStack_4e0 [32];
  undefined1 *local_4c0;
  Border local_4b8;
  Frame<plot::BrailleCanvas_*> local_438;
  Margin<plot::Frame<plot::BrailleCanvas_*>_> local_370;
  Point local_288;
  Point local_278;
  anon_class_32_4_f7f60375 local_268;
  long local_248;
  long lStack_240;
  long local_238;
  long lStack_230;
  Color local_228;
  anon_class_32_4_f7f60375 local_218;
  long local_1f8;
  long lStack_1f0;
  long local_1e8;
  long lStack_1e0;
  Color local_1d4;
  float local_1c4;
  long lStack_1c0;
  float f;
  long N;
  long A;
  long y0;
  GenericPoint<long> local_198;
  long local_188;
  GenericPoint<long> size;
  Size local_168;
  GenericPoint<long> local_158 [2];
  GenericPoint<long> local_138;
  undefined1 auStack_128 [8];
  Rect rect;
  Size local_d8;
  undefined1 local_c8 [8];
  BrailleCanvas canvas;
  Color local_44;
  undefined1 auStack_34 [8];
  TerminalInfo term;
  
  term.background_color.a = 0.0;
  plot::Color::Color(&local_44,0.9,0.9,0.9,1.0);
  plot::Color::Color((Color *)&canvas.term_.term_,0.0,0.0,0.0,1.0);
  plot::TerminalInfo::TerminalInfo
            ((TerminalInfo *)auStack_34,1,None,local_44,stack0xffffffffffffffac);
  plot::TerminalInfo::detect<void>((TerminalInfo *)auStack_34);
  plot::GenericPoint<long>::GenericPoint(&local_d8,0x1e,7);
  rect.p2.y = (long)auStack_34;
  term_00.foreground_color.g = (float)term.mode;
  term_00.foreground_color.b = term.foreground_color.r;
  term_00.mode = auStack_34._0_4_;
  term_00.foreground_color.r = (float)auStack_34._4_4_;
  term_00.foreground_color.a = term.foreground_color.g;
  term_00.background_color.r = term.foreground_color.b;
  term_00.background_color.g = term.foreground_color.a;
  term_00.background_color.b = term.background_color.r;
  term_00.background_color.a = term.background_color.g;
  term_00.term_ = (Terminal)term.background_color.b;
  plot::BrailleCanvas::BrailleCanvas((BrailleCanvas *)local_c8,local_d8,term_00);
  plot::GenericPoint<long>::GenericPoint(&local_138,0,0);
  local_168 = plot::BrailleCanvas::size((BrailleCanvas *)local_c8);
  plot::GenericPoint<long>::GenericPoint((GenericPoint<long> *)&size.y,1,2);
  local_158[0] = plot::operator-(&local_168,(GenericPoint<long> *)&size.y);
  plot::GenericRect<long>::GenericRect((GenericRect<long> *)auStack_128,&local_138,local_158);
  local_198 = plot::GenericRect<long>::size((GenericRect<long> *)auStack_128);
  plot::GenericPoint<long>::GenericPoint((GenericPoint<long> *)&y0,1,1);
  GVar4 = plot::operator+(&local_198,(GenericPoint<long> *)&y0);
  size.x = GVar4.y;
  lStack_1c0 = GVar4.x;
  A = rect.p1.x;
  N = size.x / 2;
  local_1c4 = 2.0;
  local_188 = lStack_1c0;
  plot::Color::Color(&local_1d4,0.2,0.2,1.0,1.0);
  local_1e8 = rect.p1.y;
  lStack_1e0 = rect.p2.x;
  local_1f8 = (long)auStack_128;
  lStack_1f0 = rect.p1.x;
  local_218.y0 = A;
  local_218.A = N;
  local_218.N = lStack_1c0;
  local_218.f = local_1c4;
  rct.p1.y = rect.p1.x;
  rct.p1.x = (long)auStack_128;
  rct.p2.x = rect.p1.y;
  rct.p2.y = rect.p2.x;
  pBVar1 = plot::BrailleCanvas::stroke<main::__0>
                     ((BrailleCanvas *)local_c8,&local_1d4,rct,&local_218,Over);
  plot::Color::Color(&local_228,1.0,0.4,0.4,1.0);
  local_238 = rect.p1.y;
  lStack_230 = rect.p2.x;
  local_248 = (long)auStack_128;
  lStack_240 = rect.p1.x;
  local_268.y0 = A;
  local_268.A = N;
  local_268.N = lStack_1c0;
  local_268.f = local_1c4;
  rct_00.p1.y = rect.p1.x;
  rct_00.p1.x = (long)auStack_128;
  rct_00.p2.x = rect.p1.y;
  rct_00.p2.y = rect.p2.x;
  pBVar1 = plot::BrailleCanvas::stroke<main::__1>(pBVar1,&local_228,rct_00,&local_268,Over);
  plot::GenericPoint<long>::GenericPoint(&local_278,(long)auStack_128,A + N);
  plot::GenericPoint<long>::GenericPoint(&local_288,rect.p1.y,A + N);
  plot::BrailleCanvas::line(pBVar1,(Color *)(auStack_34 + 4),local_278,local_288,ClipSrc);
  plot::Border::Border(&local_4b8,None,false);
  local_4c0 = local_c8;
  auStack_4e0._24_4_ = term.background_color.g;
  auStack_4e0._28_4_ = term.background_color.b;
  auStack_4e0._8_4_ = term.foreground_color.g;
  auStack_4e0._12_4_ = term.foreground_color.b;
  auStack_4e0._16_4_ = term.foreground_color.a;
  auStack_4e0._20_4_ = term.background_color.r;
  local_4e8 = (long)auStack_34;
  auStack_4e0._0_4_ = term.mode;
  auStack_4e0._4_4_ = term.foreground_color.r;
  uVar5 = (undefined4)local_4b8.top_left._M_len;
  uVar6 = (undefined4)(local_4b8.top_left._M_len >> 0x20);
  border.top_left._M_str = local_4b8.top_left._M_str;
  border.top_left._M_len = local_4b8.top_left._M_len;
  border.top._M_len = local_4b8.top._M_len;
  border.top._M_str = local_4b8.top._M_str;
  border.top_right._M_len = local_4b8.top_right._M_len;
  border.top_right._M_str = local_4b8.top_right._M_str;
  border.left._M_len = local_4b8.left._M_len;
  border.left._M_str = local_4b8.left._M_str;
  border.right._M_len = local_4b8.right._M_len;
  border.right._M_str = local_4b8.right._M_str;
  border.bottom_left._M_len = local_4b8.bottom_left._M_len;
  border.bottom_left._M_str = local_4b8.bottom_left._M_str;
  border.bottom._M_len = local_4b8.bottom._M_len;
  border.bottom._M_str = local_4b8.bottom._M_str;
  border.bottom_right._M_len = local_4b8.bottom_right._M_len;
  border.bottom_right._M_str = local_4b8.bottom_right._M_str;
  term_02.foreground_color.g = (float)term.mode;
  term_02.foreground_color.b = term.foreground_color.r;
  term_02.mode = auStack_34._0_4_;
  term_02.foreground_color.r = (float)auStack_34._4_4_;
  term_02.foreground_color.a = term.foreground_color.g;
  term_02.background_color.r = term.foreground_color.b;
  term_02.background_color.g = term.foreground_color.a;
  term_02.background_color.b = term.background_color.r;
  term_02.background_color.a = term.background_color.g;
  term_02.term_ = (Terminal)term.background_color.b;
  plot::frame<plot::BrailleCanvas*>(&local_438,(plot *)&local_4c0,border,block,term_02);
  block_08 = (BrailleCanvas **)0x2;
  plot::margin<plot::Frame<plot::BrailleCanvas*>>
            (&local_370,(plot *)0x1,2,0,2,(size_t)&local_438,
             (Frame<plot::BrailleCanvas_*> *)CONCAT44(uVar6,uVar5));
  poVar2 = plot::operator<<((ostream *)&std::cout,&local_370);
  std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
  basic_string_view(&local_6a8,"Label");
  auStack_6d0._32_8_ = local_c8;
  auStack_6d0._24_4_ = term.background_color.g;
  auStack_6d0._28_4_ = term.background_color.b;
  auStack_6d0._8_4_ = term.foreground_color.g;
  auStack_6d0._12_4_ = term.foreground_color.b;
  auStack_6d0._16_4_ = term.foreground_color.a;
  auStack_6d0._20_4_ = term.background_color.r;
  local_6d8 = (long)auStack_34;
  auStack_6d0._0_4_ = term.mode;
  auStack_6d0._4_4_ = term.foreground_color.r;
  uVar5 = auStack_34._0_4_;
  uVar6 = auStack_34._4_4_;
  term_01.foreground_color.g = (float)term.mode;
  term_01.foreground_color.b = term.foreground_color.r;
  term_01.mode = auStack_34._0_4_;
  term_01.foreground_color.r = (float)auStack_34._4_4_;
  term_01.foreground_color.a = term.foreground_color.g;
  term_01.background_color.r = term.foreground_color.b;
  term_01.background_color.g = term.foreground_color.a;
  term_01.background_color.b = term.background_color.r;
  term_01.background_color.a = term.background_color.g;
  term_01.term_ = (Terminal)term.background_color.b;
  label._M_str = auStack_6d0 + 0x20;
  label._M_len = (size_t)local_6a8._M_str;
  plot::frame<plot::BrailleCanvas*>(&local_698,(plot *)local_6a8._M_len,label,block_08,term_01);
  pFVar3 = &local_698;
  plot::margin<plot::Frame<plot::BrailleCanvas*>>
            (&local_5d0,(plot *)0x1,2,0,2,(size_t)pFVar3,
             (Frame<plot::BrailleCanvas_*> *)CONCAT44(uVar6,uVar5));
  poVar2 = plot::operator<<(poVar2,&local_5d0);
  std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
  basic_string_view(&local_898,"Label");
  plot::Border::Border(&local_918,Solid,true);
  local_920 = local_c8;
  auStack_940._24_4_ = term.background_color.g;
  auStack_940._28_4_ = term.background_color.b;
  auStack_940._8_4_ = term.foreground_color.g;
  auStack_940._12_4_ = term.foreground_color.b;
  auStack_940._16_4_ = term.foreground_color.a;
  auStack_940._20_4_ = term.background_color.r;
  local_948 = (long)auStack_34;
  auStack_940._0_4_ = term.mode;
  auStack_940._4_4_ = term.foreground_color.r;
  uVar5 = (undefined4)local_918.top_left._M_len;
  uVar6 = (undefined4)(local_918.top_left._M_len >> 0x20);
  border_00.top_left._M_str = local_918.top_left._M_str;
  border_00.top_left._M_len = local_918.top_left._M_len;
  border_00.top._M_len = local_918.top._M_len;
  border_00.top._M_str = local_918.top._M_str;
  border_00.top_right._M_len = local_918.top_right._M_len;
  border_00.top_right._M_str = local_918.top_right._M_str;
  border_00.left._M_len = local_918.left._M_len;
  border_00.left._M_str = local_918.left._M_str;
  border_00.right._M_len = local_918.right._M_len;
  border_00.right._M_str = local_918.right._M_str;
  border_00.bottom_left._M_len = local_918.bottom_left._M_len;
  border_00.bottom_left._M_str = local_918.bottom_left._M_str;
  border_00.bottom._M_len = local_918.bottom._M_len;
  border_00.bottom._M_str = local_918.bottom._M_str;
  border_00.bottom_right._M_len = local_918.bottom_right._M_len;
  border_00.bottom_right._M_str = local_918.bottom_right._M_str;
  term_03.foreground_color.g = (float)term.mode;
  term_03.foreground_color.b = term.foreground_color.r;
  term_03.mode = auStack_34._0_4_;
  term_03.foreground_color.r = (float)auStack_34._4_4_;
  term_03.foreground_color.a = term.foreground_color.g;
  term_03.background_color.r = term.foreground_color.b;
  term_03.background_color.g = term.foreground_color.a;
  term_03.background_color.b = term.background_color.r;
  term_03.background_color.a = term.background_color.g;
  term_03.term_ = (Terminal)term.background_color.b;
  label_00._M_str = (char *)0x1;
  label_00._M_len = (size_t)local_898._M_str;
  plot::frame<plot::BrailleCanvas*>
            (&local_888,(plot *)local_898._M_len,label_00,(Align)&local_920,border_00,
             (BrailleCanvas **)pFVar3,term_03);
  pFVar3 = &local_888;
  plot::margin<plot::Frame<plot::BrailleCanvas*>>
            (&local_7c0,(plot *)0x1,2,0,2,(size_t)pFVar3,
             (Frame<plot::BrailleCanvas_*> *)CONCAT44(uVar6,uVar5));
  poVar2 = plot::operator<<(poVar2,&local_7c0);
  std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
  basic_string_view(&local_b08,"Label");
  plot::Border::Border(&local_b88,SolidBold,false);
  local_b90 = local_c8;
  auStack_bb0._24_4_ = term.background_color.g;
  auStack_bb0._28_4_ = term.background_color.b;
  auStack_bb0._8_4_ = term.foreground_color.g;
  auStack_bb0._12_4_ = term.foreground_color.b;
  auStack_bb0._16_4_ = term.foreground_color.a;
  auStack_bb0._20_4_ = term.background_color.r;
  local_bb8 = (long)auStack_34;
  auStack_bb0._0_4_ = term.mode;
  auStack_bb0._4_4_ = term.foreground_color.r;
  uVar5 = (undefined4)local_b88.top_left._M_len;
  uVar6 = (undefined4)(local_b88.top_left._M_len >> 0x20);
  border_01.top_left._M_str = local_b88.top_left._M_str;
  border_01.top_left._M_len = local_b88.top_left._M_len;
  border_01.top._M_len = local_b88.top._M_len;
  border_01.top._M_str = local_b88.top._M_str;
  border_01.top_right._M_len = local_b88.top_right._M_len;
  border_01.top_right._M_str = local_b88.top_right._M_str;
  border_01.left._M_len = local_b88.left._M_len;
  border_01.left._M_str = local_b88.left._M_str;
  border_01.right._M_len = local_b88.right._M_len;
  border_01.right._M_str = local_b88.right._M_str;
  border_01.bottom_left._M_len = local_b88.bottom_left._M_len;
  border_01.bottom_left._M_str = local_b88.bottom_left._M_str;
  border_01.bottom._M_len = local_b88.bottom._M_len;
  border_01.bottom._M_str = local_b88.bottom._M_str;
  border_01.bottom_right._M_len = local_b88.bottom_right._M_len;
  border_01.bottom_right._M_str = local_b88.bottom_right._M_str;
  term_04.foreground_color.g = (float)term.mode;
  term_04.foreground_color.b = term.foreground_color.r;
  term_04.mode = auStack_34._0_4_;
  term_04.foreground_color.r = (float)auStack_34._4_4_;
  term_04.foreground_color.a = term.foreground_color.g;
  term_04.background_color.r = term.foreground_color.b;
  term_04.background_color.g = term.foreground_color.a;
  term_04.background_color.b = term.background_color.r;
  term_04.background_color.a = term.background_color.g;
  term_04.term_ = (Terminal)term.background_color.b;
  label_01._M_str = (char *)0x2;
  label_01._M_len = (size_t)local_b08._M_str;
  plot::frame<plot::BrailleCanvas*>
            (&local_af8,(plot *)local_b08._M_len,label_01,(Align)&local_b90,border_01,
             (BrailleCanvas **)pFVar3,term_04);
  plot::margin<plot::Frame<plot::BrailleCanvas*>>
            (&local_a30,(plot *)0x1,2,0,2,(size_t)&local_af8,
             (Frame<plot::BrailleCanvas_*> *)CONCAT44(uVar6,uVar5));
  poVar2 = plot::operator<<(poVar2,&local_a30);
  plot::Border::Border(&local_de8,Dashed,false);
  local_df0 = local_c8;
  auStack_e10._24_4_ = term.background_color.g;
  auStack_e10._28_4_ = term.background_color.b;
  auStack_e10._8_4_ = term.foreground_color.g;
  auStack_e10._12_4_ = term.foreground_color.b;
  auStack_e10._16_4_ = term.foreground_color.a;
  auStack_e10._20_4_ = term.background_color.r;
  local_e18 = (long)auStack_34;
  auStack_e10._0_4_ = term.mode;
  auStack_e10._4_4_ = term.foreground_color.r;
  uVar5 = (undefined4)local_de8.top_left._M_len;
  uVar6 = (undefined4)(local_de8.top_left._M_len >> 0x20);
  border_02.top_left._M_str = local_de8.top_left._M_str;
  border_02.top_left._M_len = local_de8.top_left._M_len;
  border_02.top._M_len = local_de8.top._M_len;
  border_02.top._M_str = local_de8.top._M_str;
  border_02.top_right._M_len = local_de8.top_right._M_len;
  border_02.top_right._M_str = local_de8.top_right._M_str;
  border_02.left._M_len = local_de8.left._M_len;
  border_02.left._M_str = local_de8.left._M_str;
  border_02.right._M_len = local_de8.right._M_len;
  border_02.right._M_str = local_de8.right._M_str;
  border_02.bottom_left._M_len = local_de8.bottom_left._M_len;
  border_02.bottom_left._M_str = local_de8.bottom_left._M_str;
  border_02.bottom._M_len = local_de8.bottom._M_len;
  border_02.bottom._M_str = local_de8.bottom._M_str;
  border_02.bottom_right._M_len = local_de8.bottom_right._M_len;
  border_02.bottom_right._M_str = local_de8.bottom_right._M_str;
  term_05.foreground_color.g = (float)term.mode;
  term_05.foreground_color.b = term.foreground_color.r;
  term_05.mode = auStack_34._0_4_;
  term_05.foreground_color.r = (float)auStack_34._4_4_;
  term_05.foreground_color.a = term.foreground_color.g;
  term_05.background_color.r = term.foreground_color.b;
  term_05.background_color.g = term.foreground_color.a;
  term_05.background_color.b = term.background_color.r;
  term_05.background_color.a = term.background_color.g;
  term_05.term_ = (Terminal)term.background_color.b;
  plot::frame<plot::BrailleCanvas*>(&local_d68,(plot *)&local_df0,border_02,block_00,term_05);
  plot::margin<plot::Frame<plot::BrailleCanvas*>>
            (&local_ca0,(plot *)0x1,2,0,2,(size_t)&local_d68,
             (Frame<plot::BrailleCanvas_*> *)CONCAT44(uVar6,uVar5));
  poVar2 = plot::operator<<(poVar2,&local_ca0);
  plot::Border::Border(&local_1048,Dashed,true);
  local_1050 = local_c8;
  auStack_1070._24_4_ = term.background_color.g;
  auStack_1070._28_4_ = term.background_color.b;
  auStack_1070._8_4_ = term.foreground_color.g;
  auStack_1070._12_4_ = term.foreground_color.b;
  auStack_1070._16_4_ = term.foreground_color.a;
  auStack_1070._20_4_ = term.background_color.r;
  local_1078 = (long)auStack_34;
  auStack_1070._0_4_ = term.mode;
  auStack_1070._4_4_ = term.foreground_color.r;
  uVar5 = (undefined4)local_1048.top_left._M_len;
  uVar6 = (undefined4)(local_1048.top_left._M_len >> 0x20);
  border_03.top_left._M_str = local_1048.top_left._M_str;
  border_03.top_left._M_len = local_1048.top_left._M_len;
  border_03.top._M_len = local_1048.top._M_len;
  border_03.top._M_str = local_1048.top._M_str;
  border_03.top_right._M_len = local_1048.top_right._M_len;
  border_03.top_right._M_str = local_1048.top_right._M_str;
  border_03.left._M_len = local_1048.left._M_len;
  border_03.left._M_str = local_1048.left._M_str;
  border_03.right._M_len = local_1048.right._M_len;
  border_03.right._M_str = local_1048.right._M_str;
  border_03.bottom_left._M_len = local_1048.bottom_left._M_len;
  border_03.bottom_left._M_str = local_1048.bottom_left._M_str;
  border_03.bottom._M_len = local_1048.bottom._M_len;
  border_03.bottom._M_str = local_1048.bottom._M_str;
  border_03.bottom_right._M_len = local_1048.bottom_right._M_len;
  border_03.bottom_right._M_str = local_1048.bottom_right._M_str;
  term_06.foreground_color.g = (float)term.mode;
  term_06.foreground_color.b = term.foreground_color.r;
  term_06.mode = auStack_34._0_4_;
  term_06.foreground_color.r = (float)auStack_34._4_4_;
  term_06.foreground_color.a = term.foreground_color.g;
  term_06.background_color.r = term.foreground_color.b;
  term_06.background_color.g = term.foreground_color.a;
  term_06.background_color.b = term.background_color.r;
  term_06.background_color.a = term.background_color.g;
  term_06.term_ = (Terminal)term.background_color.b;
  plot::frame<plot::BrailleCanvas*>(&local_fc8,(plot *)&local_1050,border_03,block_01,term_06);
  plot::margin<plot::Frame<plot::BrailleCanvas*>>
            (&local_f00,(plot *)0x1,2,0,2,(size_t)&local_fc8,
             (Frame<plot::BrailleCanvas_*> *)CONCAT44(uVar6,uVar5));
  poVar2 = plot::operator<<(poVar2,&local_f00);
  plot::Border::Border(&local_12a8,DashedBold,false);
  local_12b0 = local_c8;
  auStack_12d0._24_4_ = term.background_color.g;
  auStack_12d0._28_4_ = term.background_color.b;
  auStack_12d0._8_4_ = term.foreground_color.g;
  auStack_12d0._12_4_ = term.foreground_color.b;
  auStack_12d0._16_4_ = term.foreground_color.a;
  auStack_12d0._20_4_ = term.background_color.r;
  local_12d8 = (long)auStack_34;
  auStack_12d0._0_4_ = term.mode;
  auStack_12d0._4_4_ = term.foreground_color.r;
  uVar5 = (undefined4)local_12a8.top_left._M_len;
  uVar6 = (undefined4)(local_12a8.top_left._M_len >> 0x20);
  border_04.top_left._M_str = local_12a8.top_left._M_str;
  border_04.top_left._M_len = local_12a8.top_left._M_len;
  border_04.top._M_len = local_12a8.top._M_len;
  border_04.top._M_str = local_12a8.top._M_str;
  border_04.top_right._M_len = local_12a8.top_right._M_len;
  border_04.top_right._M_str = local_12a8.top_right._M_str;
  border_04.left._M_len = local_12a8.left._M_len;
  border_04.left._M_str = local_12a8.left._M_str;
  border_04.right._M_len = local_12a8.right._M_len;
  border_04.right._M_str = local_12a8.right._M_str;
  border_04.bottom_left._M_len = local_12a8.bottom_left._M_len;
  border_04.bottom_left._M_str = local_12a8.bottom_left._M_str;
  border_04.bottom._M_len = local_12a8.bottom._M_len;
  border_04.bottom._M_str = local_12a8.bottom._M_str;
  border_04.bottom_right._M_len = local_12a8.bottom_right._M_len;
  border_04.bottom_right._M_str = local_12a8.bottom_right._M_str;
  term_07.foreground_color.g = (float)term.mode;
  term_07.foreground_color.b = term.foreground_color.r;
  term_07.mode = auStack_34._0_4_;
  term_07.foreground_color.r = (float)auStack_34._4_4_;
  term_07.foreground_color.a = term.foreground_color.g;
  term_07.background_color.r = term.foreground_color.b;
  term_07.background_color.g = term.foreground_color.a;
  term_07.background_color.b = term.background_color.r;
  term_07.background_color.a = term.background_color.g;
  term_07.term_ = (Terminal)term.background_color.b;
  plot::frame<plot::BrailleCanvas*>(&local_1228,(plot *)&local_12b0,border_04,block_02,term_07);
  plot::margin<plot::Frame<plot::BrailleCanvas*>>
            (&local_1160,(plot *)0x1,2,0,2,(size_t)&local_1228,
             (Frame<plot::BrailleCanvas_*> *)CONCAT44(uVar6,uVar5));
  poVar2 = plot::operator<<(poVar2,&local_1160);
  plot::Border::Border(&local_1508,Dotted,false);
  local_1510 = local_c8;
  auStack_1530._24_4_ = term.background_color.g;
  auStack_1530._28_4_ = term.background_color.b;
  auStack_1530._8_4_ = term.foreground_color.g;
  auStack_1530._12_4_ = term.foreground_color.b;
  auStack_1530._16_4_ = term.foreground_color.a;
  auStack_1530._20_4_ = term.background_color.r;
  local_1538 = (long)auStack_34;
  auStack_1530._0_4_ = term.mode;
  auStack_1530._4_4_ = term.foreground_color.r;
  uVar5 = (undefined4)local_1508.top_left._M_len;
  uVar6 = (undefined4)(local_1508.top_left._M_len >> 0x20);
  border_05.top_left._M_str = local_1508.top_left._M_str;
  border_05.top_left._M_len = local_1508.top_left._M_len;
  border_05.top._M_len = local_1508.top._M_len;
  border_05.top._M_str = local_1508.top._M_str;
  border_05.top_right._M_len = local_1508.top_right._M_len;
  border_05.top_right._M_str = local_1508.top_right._M_str;
  border_05.left._M_len = local_1508.left._M_len;
  border_05.left._M_str = local_1508.left._M_str;
  border_05.right._M_len = local_1508.right._M_len;
  border_05.right._M_str = local_1508.right._M_str;
  border_05.bottom_left._M_len = local_1508.bottom_left._M_len;
  border_05.bottom_left._M_str = local_1508.bottom_left._M_str;
  border_05.bottom._M_len = local_1508.bottom._M_len;
  border_05.bottom._M_str = local_1508.bottom._M_str;
  border_05.bottom_right._M_len = local_1508.bottom_right._M_len;
  border_05.bottom_right._M_str = local_1508.bottom_right._M_str;
  term_08.foreground_color.g = (float)term.mode;
  term_08.foreground_color.b = term.foreground_color.r;
  term_08.mode = auStack_34._0_4_;
  term_08.foreground_color.r = (float)auStack_34._4_4_;
  term_08.foreground_color.a = term.foreground_color.g;
  term_08.background_color.r = term.foreground_color.b;
  term_08.background_color.g = term.foreground_color.a;
  term_08.background_color.b = term.background_color.r;
  term_08.background_color.a = term.background_color.g;
  term_08.term_ = (Terminal)term.background_color.b;
  plot::frame<plot::BrailleCanvas*>(&local_1488,(plot *)&local_1510,border_05,block_03,term_08);
  plot::margin<plot::Frame<plot::BrailleCanvas*>>
            (&local_13c0,(plot *)0x1,2,0,2,(size_t)&local_1488,
             (Frame<plot::BrailleCanvas_*> *)CONCAT44(uVar6,uVar5));
  poVar2 = plot::operator<<(poVar2,&local_13c0);
  plot::Border::Border(&local_1768,Dotted,true);
  local_1770 = local_c8;
  auStack_1790._24_4_ = term.background_color.g;
  auStack_1790._28_4_ = term.background_color.b;
  auStack_1790._8_4_ = term.foreground_color.g;
  auStack_1790._12_4_ = term.foreground_color.b;
  auStack_1790._16_4_ = term.foreground_color.a;
  auStack_1790._20_4_ = term.background_color.r;
  local_1798 = (long)auStack_34;
  auStack_1790._0_4_ = term.mode;
  auStack_1790._4_4_ = term.foreground_color.r;
  uVar5 = (undefined4)local_1768.top_left._M_len;
  uVar6 = (undefined4)(local_1768.top_left._M_len >> 0x20);
  border_06.top_left._M_str = local_1768.top_left._M_str;
  border_06.top_left._M_len = local_1768.top_left._M_len;
  border_06.top._M_len = local_1768.top._M_len;
  border_06.top._M_str = local_1768.top._M_str;
  border_06.top_right._M_len = local_1768.top_right._M_len;
  border_06.top_right._M_str = local_1768.top_right._M_str;
  border_06.left._M_len = local_1768.left._M_len;
  border_06.left._M_str = local_1768.left._M_str;
  border_06.right._M_len = local_1768.right._M_len;
  border_06.right._M_str = local_1768.right._M_str;
  border_06.bottom_left._M_len = local_1768.bottom_left._M_len;
  border_06.bottom_left._M_str = local_1768.bottom_left._M_str;
  border_06.bottom._M_len = local_1768.bottom._M_len;
  border_06.bottom._M_str = local_1768.bottom._M_str;
  border_06.bottom_right._M_len = local_1768.bottom_right._M_len;
  border_06.bottom_right._M_str = local_1768.bottom_right._M_str;
  term_09.foreground_color.g = (float)term.mode;
  term_09.foreground_color.b = term.foreground_color.r;
  term_09.mode = auStack_34._0_4_;
  term_09.foreground_color.r = (float)auStack_34._4_4_;
  term_09.foreground_color.a = term.foreground_color.g;
  term_09.background_color.r = term.foreground_color.b;
  term_09.background_color.g = term.foreground_color.a;
  term_09.background_color.b = term.background_color.r;
  term_09.background_color.a = term.background_color.g;
  term_09.term_ = (Terminal)term.background_color.b;
  plot::frame<plot::BrailleCanvas*>(&local_16e8,(plot *)&local_1770,border_06,block_04,term_09);
  plot::margin<plot::Frame<plot::BrailleCanvas*>>
            (&local_1620,(plot *)0x1,2,0,2,(size_t)&local_16e8,
             (Frame<plot::BrailleCanvas_*> *)CONCAT44(uVar6,uVar5));
  poVar2 = plot::operator<<(poVar2,&local_1620);
  plot::Border::Border(&local_19c8,DottedBold,false);
  local_19d0 = local_c8;
  auStack_19f0._24_4_ = term.background_color.g;
  auStack_19f0._28_4_ = term.background_color.b;
  auStack_19f0._8_4_ = term.foreground_color.g;
  auStack_19f0._12_4_ = term.foreground_color.b;
  auStack_19f0._16_4_ = term.foreground_color.a;
  auStack_19f0._20_4_ = term.background_color.r;
  local_19f8 = (long)auStack_34;
  auStack_19f0._0_4_ = term.mode;
  auStack_19f0._4_4_ = term.foreground_color.r;
  uVar5 = (undefined4)local_19c8.top_left._M_len;
  uVar6 = (undefined4)(local_19c8.top_left._M_len >> 0x20);
  border_07.top_left._M_str = local_19c8.top_left._M_str;
  border_07.top_left._M_len = local_19c8.top_left._M_len;
  border_07.top._M_len = local_19c8.top._M_len;
  border_07.top._M_str = local_19c8.top._M_str;
  border_07.top_right._M_len = local_19c8.top_right._M_len;
  border_07.top_right._M_str = local_19c8.top_right._M_str;
  border_07.left._M_len = local_19c8.left._M_len;
  border_07.left._M_str = local_19c8.left._M_str;
  border_07.right._M_len = local_19c8.right._M_len;
  border_07.right._M_str = local_19c8.right._M_str;
  border_07.bottom_left._M_len = local_19c8.bottom_left._M_len;
  border_07.bottom_left._M_str = local_19c8.bottom_left._M_str;
  border_07.bottom._M_len = local_19c8.bottom._M_len;
  border_07.bottom._M_str = local_19c8.bottom._M_str;
  border_07.bottom_right._M_len = local_19c8.bottom_right._M_len;
  border_07.bottom_right._M_str = local_19c8.bottom_right._M_str;
  term_10.foreground_color.g = (float)term.mode;
  term_10.foreground_color.b = term.foreground_color.r;
  term_10.mode = auStack_34._0_4_;
  term_10.foreground_color.r = (float)auStack_34._4_4_;
  term_10.foreground_color.a = term.foreground_color.g;
  term_10.background_color.r = term.foreground_color.b;
  term_10.background_color.g = term.foreground_color.a;
  term_10.background_color.b = term.background_color.r;
  term_10.background_color.a = term.background_color.g;
  term_10.term_ = (Terminal)term.background_color.b;
  plot::frame<plot::BrailleCanvas*>(&local_1948,(plot *)&local_19d0,border_07,block_05,term_10);
  plot::margin<plot::Frame<plot::BrailleCanvas*>>
            (&local_1880,(plot *)0x1,2,0,2,(size_t)&local_1948,
             (Frame<plot::BrailleCanvas_*> *)CONCAT44(uVar6,uVar5));
  poVar2 = plot::operator<<(poVar2,&local_1880);
  plot::Border::Border(&local_1c28,Double,false);
  local_1c30 = local_c8;
  border_08.top_left._M_str = local_1c28.top_left._M_str;
  border_08.top_left._M_len = local_1c28.top_left._M_len;
  border_08.top._M_len = local_1c28.top._M_len;
  border_08.top._M_str = local_1c28.top._M_str;
  border_08.top_right._M_len = local_1c28.top_right._M_len;
  border_08.top_right._M_str = local_1c28.top_right._M_str;
  border_08.left._M_len = local_1c28.left._M_len;
  border_08.left._M_str = local_1c28.left._M_str;
  border_08.right._M_len = local_1c28.right._M_len;
  border_08.right._M_str = local_1c28.right._M_str;
  border_08.bottom_left._M_len = local_1c28.bottom_left._M_len;
  border_08.bottom_left._M_str = local_1c28.bottom_left._M_str;
  border_08.bottom._M_len = local_1c28.bottom._M_len;
  border_08.bottom._M_str = local_1c28.bottom._M_str;
  border_08.bottom_right._M_len = local_1c28.bottom_right._M_len;
  border_08.bottom_right._M_str = local_1c28.bottom_right._M_str;
  term_11.foreground_color.g = (float)term.mode;
  term_11.foreground_color.b = term.foreground_color.r;
  term_11.mode = auStack_34._0_4_;
  term_11.foreground_color.r = (float)auStack_34._4_4_;
  term_11.foreground_color.a = term.foreground_color.g;
  term_11.background_color.r = term.foreground_color.b;
  term_11.background_color.g = term.foreground_color.a;
  term_11.background_color.b = term.background_color.r;
  term_11.background_color.a = term.background_color.g;
  term_11.term_ = (Terminal)term.background_color.b;
  plot::frame<plot::BrailleCanvas*>(&local_1ba8,(plot *)&local_1c30,border_08,block_06,term_11);
  plot::margin<plot::Frame<plot::BrailleCanvas*>>(&local_1ae0,(plot *)&local_1ba8,block_07);
  poVar2 = plot::operator<<(poVar2,&local_1ae0);
  std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  term.background_color.a = 0.0;
  plot::BrailleCanvas::~BrailleCanvas((BrailleCanvas *)local_c8);
  return (int)term.background_color.a;
}

Assistant:

int main() {
    TerminalInfo term;
    term.detect();

    BrailleCanvas canvas({ 30, 7 }, term);

    Rect rect({ 0, 0 }, canvas.size() - Point(1, 2));
    auto size = rect.size() + Point(1, 1);

    auto y0 = rect.p1.y, A = size.y/2, N = size.x;
    float f = 2;

    canvas.stroke({ 0.2f, 0.2f, 1.0f }, rect, [y0,A,N,f](float x) {
              Coord base = y0 + A - std::lround(A*std::sin(2*3.141592f*f*x/N)),
                    end  = y0 + A - std::lround(A*std::sin(2*3.141592f*f*(x+1)/N));
              return (base != end) ? std::make_pair(base, end) : std::make_pair(base, base+1);
          })
          .stroke({ 1.0f, 0.4f, 0.4f }, rect, [y0,A,N,f](float x) {
              Coord base = y0 + A - std::lround(A*std::cos(2*3.141592f*f*x/N)),
                    end  = y0 + A - std::lround(A*std::cos(2*3.141592f*f*(x+1)/N));
              return (base != end) ? std::make_pair(base, end) : std::make_pair(base, base+1);
          })
          .line(term.foreground_color, { rect.p1.x, y0 + A }, { rect.p2.x, y0 + A }, TerminalOp::ClipSrc);

    std::cout << margin(1, 2, 0, 2, frame(BorderStyle::None, &canvas, term))
              << margin(1, 2, 0, 2, frame(u8"Label", &canvas, term))
              << margin(1, 2, 0, 2, frame(u8"Label", Align::Center, { BorderStyle::Solid, true }, &canvas, term))
              << margin(1, 2, 0, 2, frame(u8"Label", Align::Right, BorderStyle::SolidBold, &canvas, term))
              << margin(1, 2, 0, 2, frame(BorderStyle::Dashed, &canvas, term))
              << margin(1, 2, 0, 2, frame({ BorderStyle::Dashed, true }, &canvas, term))
              << margin(1, 2, 0, 2, frame(BorderStyle::DashedBold, &canvas, term))
              << margin(1, 2, 0, 2, frame(BorderStyle::Dotted, &canvas, term))
              << margin(1, 2, 0, 2, frame({ BorderStyle::Dotted, true }, &canvas, term))
              << margin(1, 2, 0, 2, frame(BorderStyle::DottedBold, &canvas, term))
              << margin(frame(BorderStyle::Double, &canvas, term)) << std::flush;

    return 0;
}